

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.h
# Opt level: O0

LinkedModelFile * __thiscall
CoreML::Specification::LinkedModel::mutable_linkedmodelfile(LinkedModel *this)

{
  bool bVar1;
  LinkedModelFile *this_00;
  LinkedModel *this_local;
  
  bVar1 = has_linkedmodelfile(this);
  if (!bVar1) {
    clear_LinkType(this);
    set_has_linkedmodelfile(this);
    this_00 = (LinkedModelFile *)operator_new(0x28);
    LinkedModelFile::LinkedModelFile(this_00);
    (this->LinkType_).linkedmodelfile_ = this_00;
  }
  return (this->LinkType_).linkedmodelfile_;
}

Assistant:

inline ::CoreML::Specification::LinkedModelFile* LinkedModel::mutable_linkedmodelfile() {
  if (!has_linkedmodelfile()) {
    clear_LinkType();
    set_has_linkedmodelfile();
    LinkType_.linkedmodelfile_ = new ::CoreML::Specification::LinkedModelFile;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LinkedModel.linkedModelFile)
  return LinkType_.linkedmodelfile_;
}